

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

CBString * __thiscall Bstrlib::CBString::operator+=(CBString *this,tagbstring *x)

{
  CBStringException *pCVar1;
  allocator local_111;
  string local_110;
  undefined1 local_f0 [8];
  CBStringException bstr__cppwrapper_exception_2;
  string local_c0;
  undefined1 local_a0 [8];
  CBStringException bstr__cppwrapper_exception_1;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  CBStringException bstr__cppwrapper_exception;
  tagbstring *x_local;
  CBString *this_local;
  
  bstr__cppwrapper_exception.msg.field_2._8_8_ = x;
  if ((this->super_tagbstring).mlen < 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,"CBString::Write protection error",&local_61);
    CBStringException::CBStringException((CBStringException *)local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    pCVar1 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar1,(CBStringException *)local_40);
    __cxa_throw(pCVar1,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  if (x->slen < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_c0,
               "CBString::Failure in +=(tagbstring) operator, badly formed tagbstring",
               (allocator *)(bstr__cppwrapper_exception_2.msg.field_2._M_local_buf + 0xf));
    CBStringException::CBStringException((CBStringException *)local_a0,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator
              ((allocator<char> *)(bstr__cppwrapper_exception_2.msg.field_2._M_local_buf + 0xf));
    pCVar1 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar1,(CBStringException *)local_a0);
    __cxa_throw(pCVar1,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  alloc(this,x->slen + (this->super_tagbstring).slen + 1);
  if ((this->super_tagbstring).data == (uchar *)0x0) {
    (this->super_tagbstring).slen = 0;
    (this->super_tagbstring).mlen = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_110,"CBString::Failure in +=(tagbstring) operator",&local_111);
    CBStringException::CBStringException((CBStringException *)local_f0,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    pCVar1 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar1,(CBStringException *)local_f0);
    __cxa_throw(pCVar1,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  memcpy((this->super_tagbstring).data + (this->super_tagbstring).slen,
         *(void **)(bstr__cppwrapper_exception.msg.field_2._8_8_ + 8),
         (long)*(int *)(bstr__cppwrapper_exception.msg.field_2._8_8_ + 4));
  (this->super_tagbstring).slen =
       *(int *)(bstr__cppwrapper_exception.msg.field_2._8_8_ + 4) + (this->super_tagbstring).slen;
  (this->super_tagbstring).data[(this->super_tagbstring).slen] = '\0';
  return this;
}

Assistant:

const CBString& CBString::operator += (const tagbstring& x) {
	if (mlen <= 0) bstringThrow ("Write protection error");
	if (x.slen < 0) bstringThrow ("Failure in +=(tagbstring) operator, badly formed tagbstring");
	alloc (x.slen + slen + 1);

	if (!data) {
		mlen = slen = 0;
		bstringThrow ("Failure in +=(tagbstring) operator");
	} else {
		bstr__memcpy (data + slen, x.data, x.slen);
		slen += x.slen;
		data[slen] = '\0';
	}
	return *this;
}